

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,int httpversion,dynbuf *req)

{
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  void *pvVar5;
  curl_slist *pcVar6;
  undefined7 in_register_00000031;
  long lVar7;
  char cVar8;
  bool bVar9;
  curl_slist *h [2];
  char *p;
  Curl_str name;
  Curl_str val;
  long local_88;
  CURLcode local_80;
  curl_slist *local_78 [3];
  dynbuf *local_60;
  char *local_58;
  Curl_str local_50;
  Curl_str local_40;
  
  local_60 = req;
  cVar8 = '\x02';
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    cVar8 = ((ulong)data->conn->bits & 9) == 1;
  }
  if (cVar8 == '\x02') {
    if (((data->set).field_0x89c & 0x40) == 0) goto LAB_0013736d;
    local_78[0] = (data->set).proxyheaders;
  }
  else {
    if (cVar8 == '\x01') {
      local_78[0] = (data->set).headers;
      local_88 = 1;
      if (((data->set).field_0x89c & 0x40) != 0) {
        local_78[1] = (data->set).proxyheaders;
        local_88 = 2;
      }
      goto LAB_0013738c;
    }
LAB_0013736d:
    local_78[0] = (data->set).headers;
  }
  local_88 = 1;
LAB_0013738c:
  lVar7 = 0;
  do {
    for (pcVar6 = local_78[lVar7]; pcVar6 != (curl_slist *)0x0; pcVar6 = pcVar6->next) {
      pcVar1 = pcVar6->data;
      local_58 = pcVar1;
      iVar3 = Curl_str_until(&local_58,&local_50,0x4b000,';');
      if ((((iVar3 == 0) && (iVar3 = Curl_str_single(&local_58,';'), iVar3 == 0)) &&
          (iVar3 = Curl_str_single(&local_58,'\0'), iVar3 == 0)) &&
         (pvVar5 = memchr(local_50.str,0x3a,CONCAT44(local_50.len._4_4_,(uint)local_50.len)),
         pvVar5 == (void *)0x0)) {
        bVar9 = true;
LAB_0013747a:
        if ((((((((data->state).aptr.host == (char *)0x0) ||
                (iVar3 = Curl_str_casecompare(&local_50,"Host"), iVar3 == 0)) &&
               (((data->state).httpreq != '\x02' ||
                (iVar3 = Curl_str_casecompare(&local_50,"Content-Type"), iVar3 == 0)))) &&
              (((data->state).httpreq != '\x03' ||
               (iVar3 = Curl_str_casecompare(&local_50,"Content-Type"), iVar3 == 0)))) &&
             ((((data->req).field_0xd3 & 4) == 0 ||
              (iVar3 = Curl_str_casecompare(&local_50,"Content-Length"), iVar3 == 0)))) &&
            ((((data->state).aptr.te == (char *)0x0 ||
              (iVar3 = Curl_str_casecompare(&local_50,"Connection"), iVar3 == 0)) &&
             ((httpversion < 0x14 ||
              (iVar3 = Curl_str_casecompare(&local_50,"Transfer-Encoding"), iVar3 == 0)))))) &&
           (((iVar3 = Curl_str_casecompare(&local_50,"Authorization"), iVar3 == 0 &&
             (iVar3 = Curl_str_casecompare(&local_50,"Cookie"), iVar3 == 0)) ||
            (_Var2 = Curl_auth_allowed_to_host(data), _Var2)))) {
          if (bVar9) {
            CVar4 = Curl_dyn_addf(local_60,"%.*s:\r\n",(ulong)(uint)local_50.len,local_50.str);
          }
          else {
            CVar4 = Curl_dyn_addf(local_60,"%s\r\n",pcVar1);
          }
        }
        else {
          CVar4 = CURLE_OK;
        }
        bVar9 = CVar4 != CURLE_OK;
        if (bVar9) {
          local_80 = CVar4;
        }
      }
      else {
        local_58 = pcVar1;
        iVar3 = Curl_str_until(&local_58,&local_50,0x4b000,':');
        bVar9 = false;
        if ((iVar3 == 0) && (iVar3 = Curl_str_single(&local_58,':'), iVar3 == 0)) {
          Curl_str_untilnl(&local_58,&local_40,0x4b000);
          Curl_str_trimblanks(&local_40);
          if (local_40.len != 0) {
            bVar9 = false;
            goto LAB_0013747a;
          }
          bVar9 = false;
        }
      }
      if (bVar9) {
        return local_80;
      }
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == local_88) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect, int httpversion,
                                 struct dynbuf *req)
{
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum Curl_proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = data->conn->bits.httpproxy && !data->conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      CURLcode result = CURLE_OK;
      bool blankheader = FALSE;
      struct Curl_str name;
      const char *p = headers->data;
      const char *origp = p;

      /* explicitly asked to send header without content is done by a header
         that ends with a semicolon, but there must be no colon present in the
         name */
      if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ';') &&
         !Curl_str_single(&p, ';') &&
         !Curl_str_single(&p, '\0') &&
         !memchr(Curl_str(&name), ':', Curl_strlen(&name)))
        blankheader = TRUE;
      else {
        p = origp;
        if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ':') &&
           !Curl_str_single(&p, ':')) {
          struct Curl_str val;
          Curl_str_untilnl(&p, &val, MAX_HTTP_RESP_HEADER_SIZE);
          Curl_str_trimblanks(&val);
          if(!Curl_strlen(&val))
            /* no content, don't send this */
            continue;
        }
        else
          /* no colon */
          continue;
      }

      /* only send this if the contents was non-blank or done special */

      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom
            Host: header as that will produce *two* in the same
            request! */
         Curl_str_casecompare(&name, "Host"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              Curl_str_casecompare(&name, "Content-Length"))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              Curl_str_casecompare(&name, "Connection"))
        ;
      else if((httpversion >= 20) &&
              Curl_str_casecompare(&name, "Transfer-Encoding"))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((Curl_str_casecompare(&name, "Authorization") ||
               Curl_str_casecompare(&name, "Cookie")) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else if(blankheader)
        result = Curl_dyn_addf(req, "%.*s:\r\n", (int)Curl_strlen(&name),
                               Curl_str(&name));
      else
        result = Curl_dyn_addf(req, "%s\r\n", origp);

      if(result)
        return result;
    }
  }

  return CURLE_OK;
}